

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O0

_Bool Hacl_RSAPSS_rsapss_sign
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint32_t dBits,
                uint64_t *skey,uint32_t saltLen,uint8_t *salt,uint32_t msgLen,uint8_t *msg,
                uint8_t *sgnt)

{
  uint64_t b_00;
  long lVar1;
  void *pvVar2;
  uint8_t *b_01;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *n_00;
  uint32_t uVar5;
  uint32_t saltLen_00;
  Spec_Hash_Definitions_hash_alg a_00;
  uint64_t uVar6;
  ulong uVar7;
  uint uVar8;
  uint8_t *__s;
  uint64_t *puVar9;
  void *__s_00;
  uint8_t auStack_130 [8];
  uint64_t uStack_128;
  uint64_t uStack_120;
  uint64_t uStack_118;
  void *local_110;
  uint64_t *local_108;
  uint8_t *local_100;
  uint64_t *local_f8;
  bool local_eb;
  byte local_e9;
  _Bool eq_b0;
  ulong uStack_e8;
  _Bool eq_b;
  uint64_t x0;
  uint64_t x;
  uint64_t *os;
  ulong uStack_c8;
  uint32_t i_1;
  uint64_t eq_m;
  uint64_t mask1;
  uint64_t uu____0;
  ulong uStack_a8;
  uint32_t i;
  uint64_t mask;
  uint64_t mu0;
  uint64_t mu;
  uint64_t *d;
  uint64_t *e;
  uint64_t *r2;
  uint64_t *n;
  uint32_t eLen;
  uint32_t nLen2;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  uint32_t k;
  uint32_t nLen1;
  unsigned_long __vla_expr1;
  uint32_t emLen;
  uint32_t emBits;
  unsigned_long __vla_expr0;
  uint local_30;
  bool local_29;
  uint32_t nLen;
  uint32_t uStack_24;
  _Bool b;
  uint32_t hLen;
  uint32_t saltLen_local;
  uint64_t *skey_local;
  uint32_t dBits_local;
  uint32_t eBits_local;
  uint32_t modBits_local;
  Spec_Hash_Definitions_hash_alg a_local;
  
  uStack_120 = 0x26f78a;
  uStack_24 = saltLen;
  _hLen = skey;
  skey_local._0_4_ = dBits;
  skey_local._4_4_ = eBits;
  dBits_local = modBits;
  eBits_local._2_1_ = a;
  nLen = hash_len(a);
  local_eb = false;
  if (uStack_24 <= 0xfffffff7 - nLen) {
    local_eb = uStack_24 + nLen + 2 <= (dBits_local - 2 >> 3) + 1;
  }
  local_29 = local_eb;
  if (local_eb == false) {
    eBits_local._3_1_ = false;
  }
  else {
    local_30 = (dBits_local - 1 >> 6) + 1;
    if (0x1fffffffffffffff < (ulong)local_30) {
      uStack_120 = 0x26f81a;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_RSAPSS.c"
             ,0x1b5);
      uStack_120 = 0x26f824;
      exit(0xfd);
    }
    _emLen = (ulong)local_30;
    lVar1 = -(_emLen * 8 + 0xf & 0xfffffffffffffff0);
    puVar9 = (uint64_t *)((long)&uStack_118 + lVar1);
    uVar7 = (ulong)local_30;
    local_f8 = puVar9;
    __vla_expr0 = (unsigned_long)&uStack_118;
    *(undefined8 *)((long)&uStack_120 + lVar1) = 0x26f860;
    memset(puVar9,0,uVar7 << 3);
    __vla_expr1._4_4_ = dBits_local - 1;
    __vla_expr1._0_4_ = (dBits_local - 2 >> 3) + 1;
    _k = (ulong)(uint)__vla_expr1;
    __s = (uint8_t *)((long)puVar9 - (_k + 0xf & 0xfffffffffffffff0));
    uVar7 = (ulong)(uint)__vla_expr1;
    local_100 = __s;
    __s[-8] = 0xdb;
    __s[-7] = 0xf8;
    __s[-6] = '&';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    memset(__s,0,uVar7);
    a_00 = eBits_local._2_1_;
    saltLen_00 = uStack_24;
    uVar5 = __vla_expr1._4_4_;
    *(uint8_t **)(__s + -0x10) = local_100;
    __s[-0x18] = '\t';
    __s[-0x17] = 0xf9;
    __s[-0x16] = '&';
    __s[-0x15] = '\0';
    __s[-0x14] = '\0';
    __s[-0x13] = '\0';
    __s[-0x12] = '\0';
    __s[-0x11] = '\0';
    pss_encode(a_00,saltLen_00,salt,msgLen,msg,uVar5,*(uint8_t **)(__s + -0x10));
    uVar5 = (uint)__vla_expr1;
    puVar9 = local_f8;
    b_01 = local_100;
    __s[-8] = '#';
    __s[-7] = 0xf9;
    __s[-6] = '&';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar5,b_01,puVar9);
    __vla_expr2._4_4_ = (dBits_local - 1 >> 6) + 1;
    __vla_expr2._0_4_ = (dBits_local - 1 >> 3) + 1;
    if (0x1fffffffffffffff < (ulong)__vla_expr2._4_4_) {
      __s[-8] = 'm';
      __s[-7] = 0xf9;
      __s[-6] = '&';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_RSAPSS.c"
             ,0x1c1);
      __s[-8] = 'w';
      __s[-7] = 0xf9;
      __s[-6] = '&';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      exit(0xfd);
    }
    __vla_expr3 = (unsigned_long)__vla_expr2._4_4_;
    puVar9 = (uint64_t *)(__s + -(__vla_expr3 * 8 + 0xf & 0xfffffffffffffff0));
    uVar7 = (ulong)__vla_expr2._4_4_;
    local_108 = puVar9;
    puVar9[-1] = 0x26f9ae;
    memset(puVar9,0,uVar7 << 3);
    if (0x1fffffffffffffff < (ulong)__vla_expr2._4_4_) {
      puVar9[-1] = 0x26f9da;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_RSAPSS.c"
             ,0x1c4);
      puVar9[-1] = 0x26f9e4;
      exit(0xfd);
    }
    _eLen = (ulong)__vla_expr2._4_4_;
    __s_00 = (void *)((long)puVar9 - (_eLen * 8 + 0xf & 0xfffffffffffffff0));
    uVar7 = (ulong)__vla_expr2._4_4_;
    local_110 = __s_00;
    *(undefined8 *)((long)__s_00 + -8) = 0x26fa1b;
    memset(__s_00,0,uVar7 << 3);
    n._4_4_ = (dBits_local - 1 >> 6) + 1;
    n._0_4_ = (skey_local._4_4_ - 1 >> 6) + 1;
    r2 = _hLen;
    e = _hLen + n._4_4_;
    d = _hLen + (ulong)n._4_4_ + (ulong)n._4_4_;
    mu = (uint64_t)(_hLen + (ulong)n._4_4_ + (ulong)n._4_4_ + (ulong)(uint)n);
    uVar6 = *_hLen;
    *(undefined8 *)((long)__s_00 + -8) = 0x26faa4;
    uVar6 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar6);
    uVar5 = (uint32_t)skey_local;
    n_00 = r2;
    puVar4 = e;
    puVar3 = local_f8;
    puVar9 = local_108;
    mu0 = uVar6;
    uVar8 = dBits_local - 1;
    *(uint64_t *)((long)__s_00 + -0x10) = mu;
    *(uint64_t **)((long)__s_00 + -8) = puVar9;
    *(undefined8 *)((long)__s_00 + -0x18) = 0x26faf4;
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
              ((uVar8 >> 6) + 1,n_00,uVar6,puVar4,puVar3,uVar5,*(uint64_t **)((long)__s_00 + -0x10),
               *(uint64_t **)((long)__s_00 + -8));
    uVar6 = *r2;
    *(undefined8 *)((long)__s_00 + -8) = 0x26fb04;
    uVar6 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(uVar6);
    uVar5 = skey_local._4_4_;
    puVar4 = r2;
    puVar3 = e;
    puVar9 = local_108;
    pvVar2 = local_110;
    mask = uVar6;
    uVar8 = dBits_local - 1;
    *(uint64_t **)((long)__s_00 + -0x10) = d;
    *(void **)((long)__s_00 + -8) = pvVar2;
    *(undefined8 *)((long)__s_00 + -0x18) = 0x26fb51;
    Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64
              ((uVar8 >> 6) + 1,puVar4,uVar6,puVar3,puVar9,uVar5,
               *(uint64_t **)((long)__s_00 + -0x10),*(uint64_t **)((long)__s_00 + -8));
    uStack_a8 = 0xffffffffffffffff;
    for (uu____0._4_4_ = 0; uVar5 = (uint32_t)__vla_expr2, puVar9 = local_108,
        uu____0._4_4_ < n._4_4_; uu____0._4_4_ = uu____0._4_4_ + 1) {
      uVar6 = local_f8[uu____0._4_4_];
      b_00 = *(uint64_t *)((long)local_110 + (ulong)uu____0._4_4_ * 8);
      *(undefined8 *)((long)__s_00 + -8) = 0x26fb9c;
      mask1 = FStar_UInt64_eq_mask(uVar6,b_00);
      uStack_a8 = mask1 & uStack_a8;
    }
    eq_m = uStack_a8;
    uStack_c8 = uStack_a8;
    for (os._4_4_ = 0; os._4_4_ < n._4_4_; os._4_4_ = os._4_4_ + 1) {
      x = (uint64_t)local_108;
      x0 = local_108[os._4_4_];
      uStack_e8 = uStack_a8 & x0;
      local_108[os._4_4_] = uStack_e8;
    }
    local_e9 = uStack_a8 == 0xffffffffffffffff;
    *(undefined8 *)((long)__s_00 + -8) = 0x26fc7d;
    Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uVar5,puVar9,sgnt);
    eBits_local._3_1_ = (_Bool)(local_e9 & 1);
  }
  return eBits_local._3_1_;
}

Assistant:

bool
Hacl_RSAPSS_rsapss_sign(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint32_t dBits,
  uint64_t *skey,
  uint32_t saltLen,
  uint8_t *salt,
  uint32_t msgLen,
  uint8_t *msg,
  uint8_t *sgnt
)
{
  uint32_t hLen = hash_len(a);
  bool
  b = saltLen <= 0xffffffffU - hLen - 8U && saltLen + hLen + 2U <= (modBits - 1U - 1U) / 8U + 1U;
  if (b)
  {
    uint32_t nLen = (modBits - 1U) / 64U + 1U;
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen);
    uint64_t m[nLen];
    memset(m, 0U, nLen * sizeof (uint64_t));
    uint32_t emBits = modBits - 1U;
    uint32_t emLen = (emBits - 1U) / 8U + 1U;
    KRML_CHECK_SIZE(sizeof (uint8_t), emLen);
    uint8_t em[emLen];
    memset(em, 0U, emLen * sizeof (uint8_t));
    pss_encode(a, saltLen, salt, msgLen, msg, emBits, em);
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(emLen, em, m);
    uint32_t nLen1 = (modBits - 1U) / 64U + 1U;
    uint32_t k = (modBits - 1U) / 8U + 1U;
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen1);
    uint64_t s[nLen1];
    memset(s, 0U, nLen1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), nLen1);
    uint64_t m_[nLen1];
    memset(m_, 0U, nLen1 * sizeof (uint64_t));
    uint32_t nLen2 = (modBits - 1U) / 64U + 1U;
    uint32_t eLen = (eBits - 1U) / 64U + 1U;
    uint64_t *n = skey;
    uint64_t *r2 = skey + nLen2;
    uint64_t *e = skey + nLen2 + nLen2;
    uint64_t *d = skey + nLen2 + nLen2 + eLen;
    uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64((modBits - 1U) / 64U + 1U,
      n,
      mu,
      r2,
      m,
      dBits,
      d,
      s);
    uint64_t mu0 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(n[0U]);
    Hacl_Bignum_Exponentiation_bn_mod_exp_vartime_precomp_u64((modBits - 1U) / 64U + 1U,
      n,
      mu0,
      r2,
      s,
      eBits,
      e,
      m_);
    uint64_t mask = 0xFFFFFFFFFFFFFFFFULL;
    for (uint32_t i = 0U; i < nLen2; i++)
    {
      uint64_t uu____0 = FStar_UInt64_eq_mask(m[i], m_[i]);
      mask = uu____0 & mask;
    }
    uint64_t mask1 = mask;
    uint64_t eq_m = mask1;
    for (uint32_t i = 0U; i < nLen2; i++)
    {
      uint64_t *os = s;
      uint64_t x = s[i];
      uint64_t x0 = eq_m & x;
      os[i] = x0;
    }
    bool eq_b = eq_m == 0xFFFFFFFFFFFFFFFFULL;
    Hacl_Bignum_Convert_bn_to_bytes_be_uint64(k, s, sgnt);
    bool eq_b0 = eq_b;
    return eq_b0;
  }
  return false;
}